

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_soup_mesh_builder.cc
# Opt level: O1

int __thiscall
draco::TriangleSoupMeshBuilder::AddAttribute
          (TriangleSoupMeshBuilder *this,Type attribute_type,int8_t num_components,
          DataType data_type,bool normalized)

{
  Mesh *this_00;
  int32_t iVar1;
  int iVar2;
  undefined7 in_register_00000011;
  char local_71;
  GeometryAttribute va;
  
  GeometryAttribute::GeometryAttribute(&va);
  iVar1 = DataTypeLength(data_type);
  GeometryAttribute::Init
            (&va,attribute_type,(DataBuffer *)0x0,num_components,data_type,normalized,
             (long)(iVar1 * (int)CONCAT71(in_register_00000011,num_components)),0);
  local_71 = -1;
  std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
            (&this->attribute_element_types_,&local_71);
  this_00 = (this->mesh_)._M_t.super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>
            ._M_t.super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
            super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl;
  iVar2 = PointCloud::AddAttribute
                    (&this_00->super_PointCloud,&va,true,(this_00->super_PointCloud).num_points_);
  return iVar2;
}

Assistant:

int TriangleSoupMeshBuilder::AddAttribute(
    GeometryAttribute::Type attribute_type, int8_t num_components,
    DataType data_type, bool normalized) {
  GeometryAttribute va;
  va.Init(attribute_type, nullptr, num_components, data_type, normalized,
          DataTypeLength(data_type) * num_components, 0);
  attribute_element_types_.push_back(-1);
  return mesh_->AddAttribute(va, true, mesh_->num_points());
}